

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

size_type __thiscall
phmap::priv::
parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int,phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int>,phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Hash,phmap::EqualTo<phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int_const,phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int>>>
::
erase<phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int>
          (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int,phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int>,phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Hash,phmap::EqualTo<phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int>,std::allocator<std::pair<phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int_const,phmap::priv::(anonymous_namespace)::ParallelNodeHashMap_StandardLayout_Test::TestBody()::Int>>>
           *this,key_arg<Int> *key)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  ushort uVar4;
  ushort uVar5;
  char cVar6;
  ctrl_t h;
  size_type extraout_RAX;
  ulong uVar7;
  long lVar8;
  raw_hash_set<phmap::priv::NodeHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
  *this_00;
  size_t i;
  ulong uVar9;
  uint uVar10;
  char *pcVar11;
  ulong uVar12;
  bool bVar13;
  __m128i match;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  __m128i match_1;
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  char cVar18;
  char cVar20;
  char cVar21;
  char cVar22;
  
  auVar14._8_8_ = 0;
  auVar14._0_8_ = key;
  uVar7 = SUB168(auVar14 * ZEXT816(0xde5fb9d2630458e9),8) +
          SUB168(auVar14 * ZEXT816(0xde5fb9d2630458e9),0);
  uVar9 = (ulong)((((uint)(uVar7 >> 0x18) & 0xff ^
                   (uint)(uVar7 >> 8) & 0xffffff ^ (uint)(uVar7 >> 0x10) & 0xffff) & 0xf) * 0x30);
  uVar12 = *(ulong *)(this + uVar9 + 0x18);
  if ((uVar12 + 1 & uVar12) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
  }
  this_00 = (raw_hash_set<phmap::priv::NodeHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
             *)(this + uVar9);
  uVar9 = uVar7 >> 7;
  auVar14 = ZEXT216(CONCAT11((char)uVar7,(char)uVar7) & 0x7f7f);
  auVar14 = pshuflw(auVar14,auVar14,0);
  lVar8 = 0;
  do {
    uVar9 = uVar9 & uVar12;
    pcVar11 = this_00->ctrl_ + uVar9;
    cVar6 = pcVar11[0xf];
    cVar18 = auVar14[0];
    auVar19[0] = -(cVar18 == *pcVar11);
    cVar20 = auVar14[1];
    auVar19[1] = -(cVar20 == pcVar11[1]);
    cVar21 = auVar14[2];
    auVar19[2] = -(cVar21 == pcVar11[2]);
    cVar22 = auVar14[3];
    auVar19[3] = -(cVar22 == pcVar11[3]);
    auVar19[4] = -(cVar18 == pcVar11[4]);
    auVar19[5] = -(cVar20 == pcVar11[5]);
    auVar19[6] = -(cVar21 == pcVar11[6]);
    auVar19[7] = -(cVar22 == pcVar11[7]);
    auVar19[8] = -(cVar18 == pcVar11[8]);
    auVar19[9] = -(cVar20 == pcVar11[9]);
    auVar19[10] = -(cVar21 == pcVar11[10]);
    auVar19[0xb] = -(cVar22 == pcVar11[0xb]);
    auVar19[0xc] = -(cVar18 == pcVar11[0xc]);
    auVar19[0xd] = -(cVar20 == pcVar11[0xd]);
    auVar19[0xe] = -(cVar21 == pcVar11[0xe]);
    auVar19[0xf] = -(cVar22 == cVar6);
    uVar4 = (ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe | (ushort)(auVar19[0xf] >> 7) << 0xf;
    if (uVar4 != 0) {
      uVar10 = (uint)uVar4;
      do {
        uVar2 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        uVar7 = uVar2 + uVar9 & uVar12;
        if ((key_arg<Int> *)(this_00->slots_[uVar7]->first).value == key) {
          if (uVar7 == uVar12) {
            return uVar12;
          }
          pcVar11 = this_00->ctrl_ + uVar7;
          operator_delete(this_00->slots_[uVar7],0x10);
          if (-1 < *pcVar11) {
            this_00->size_ = this_00->size_ - 1;
            i = (long)pcVar11 - (long)this_00->ctrl_;
            pcVar1 = this_00->ctrl_ + (i - 0x10 & this_00->capacity_);
            auVar15[0] = -(*pcVar1 == -0x80);
            auVar15[1] = -(pcVar1[1] == -0x80);
            auVar15[2] = -(pcVar1[2] == -0x80);
            auVar15[3] = -(pcVar1[3] == -0x80);
            auVar15[4] = -(pcVar1[4] == -0x80);
            auVar15[5] = -(pcVar1[5] == -0x80);
            auVar15[6] = -(pcVar1[6] == -0x80);
            auVar15[7] = -(pcVar1[7] == -0x80);
            auVar15[8] = -(pcVar1[8] == -0x80);
            auVar15[9] = -(pcVar1[9] == -0x80);
            auVar15[10] = -(pcVar1[10] == -0x80);
            auVar15[0xb] = -(pcVar1[0xb] == -0x80);
            auVar15[0xc] = -(pcVar1[0xc] == -0x80);
            auVar15[0xd] = -(pcVar1[0xd] == -0x80);
            auVar15[0xe] = -(pcVar1[0xe] == -0x80);
            auVar15[0xf] = -(pcVar1[0xf] == -0x80);
            uVar4 = (ushort)(SUB161(auVar15 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar15[0xf] >> 7) << 0xf;
            uVar12 = 0;
            h = -2;
            if (uVar4 != 0) {
              auVar16[0] = -(*pcVar11 == -0x80);
              auVar16[1] = -(pcVar11[1] == -0x80);
              auVar16[2] = -(pcVar11[2] == -0x80);
              auVar16[3] = -(pcVar11[3] == -0x80);
              auVar16[4] = -(pcVar11[4] == -0x80);
              auVar16[5] = -(pcVar11[5] == -0x80);
              auVar16[6] = -(pcVar11[6] == -0x80);
              auVar16[7] = -(pcVar11[7] == -0x80);
              auVar16[8] = -(pcVar11[8] == -0x80);
              auVar16[9] = -(pcVar11[9] == -0x80);
              auVar16[10] = -(pcVar11[10] == -0x80);
              auVar16[0xb] = -(pcVar11[0xb] == -0x80);
              auVar16[0xc] = -(pcVar11[0xc] == -0x80);
              auVar16[0xd] = -(pcVar11[0xd] == -0x80);
              auVar16[0xe] = -(pcVar11[0xe] == -0x80);
              auVar16[0xf] = -(pcVar11[0xf] == -0x80);
              uVar5 = (ushort)(SUB161(auVar16 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar16[0xf] >> 7) << 0xf;
              if (uVar5 != 0) {
                iVar3 = 0;
                if (uVar5 != 0) {
                  for (; (uVar5 >> iVar3 & 1) == 0; iVar3 = iVar3 + 1) {
                  }
                }
                uVar10 = 0x1f;
                if (uVar4 != 0) {
                  for (; ((uint)uVar4 << 0x10) >> uVar10 == 0; uVar10 = uVar10 - 1) {
                  }
                }
                bVar13 = (uVar10 ^ 0x1f) + iVar3 < 0x10;
                uVar12 = (ulong)bVar13;
                h = -2;
                if (bVar13) {
                  h = -0x80;
                }
              }
            }
            raw_hash_set<phmap::priv::NodeHashMapPolicy<Int,_Int>,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
            ::set_ctrl(this_00,i,h);
            (this_00->settings_).
            super__Tuple_impl<0UL,_unsigned_long,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
            .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
                 (this_00->settings_).
                 super__Tuple_impl<0UL,_unsigned_long,_Hash,_phmap::EqualTo<Int>,_std::allocator<std::pair<const_Int,_Int>_>_>
                 .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl + uVar12;
            return extraout_RAX;
          }
          __assert_fail("IsFull(*it.inner_.ctrl_) && \"erasing a dangling iterator\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                        ,0x7c8,
                        "void phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<Int, Int>, Hash, phmap::EqualTo<Int>, std::allocator<std::pair<const Int, Int>>>::erase_meta_only(const_iterator) [Policy = phmap::priv::NodeHashMapPolicy<Int, Int>, Hash = Hash, Eq = phmap::EqualTo<Int>, Alloc = std::allocator<std::pair<const Int, Int>>]"
                       );
        }
        uVar10 = uVar10 - 1 & uVar10;
      } while (uVar10 != 0);
    }
    auVar17[0] = -(*pcVar11 == -0x80);
    auVar17[1] = -(pcVar11[1] == -0x80);
    auVar17[2] = -(pcVar11[2] == -0x80);
    auVar17[3] = -(pcVar11[3] == -0x80);
    auVar17[4] = -(pcVar11[4] == -0x80);
    auVar17[5] = -(pcVar11[5] == -0x80);
    auVar17[6] = -(pcVar11[6] == -0x80);
    auVar17[7] = -(pcVar11[7] == -0x80);
    auVar17[8] = -(pcVar11[8] == -0x80);
    auVar17[9] = -(pcVar11[9] == -0x80);
    auVar17[10] = -(pcVar11[10] == -0x80);
    auVar17[0xb] = -(pcVar11[0xb] == -0x80);
    auVar17[0xc] = -(pcVar11[0xc] == -0x80);
    auVar17[0xd] = -(pcVar11[0xd] == -0x80);
    auVar17[0xe] = -(pcVar11[0xe] == -0x80);
    auVar17[0xf] = -(cVar6 == -0x80);
    if ((((((((((((((((auVar17 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar17 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar17 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar17 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar17 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar17 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar17 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar17 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar17 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar17 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar17 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar17 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar17 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar6 == -0x80) {
      return uVar12;
    }
    uVar9 = uVar9 + lVar8 + 0x10;
    lVar8 = lVar8 + 0x10;
  } while( true );
}

Assistant:

size_type erase(const key_arg<K>& key) {
        auto always_erase =  [](const value_type&){ return true; };
        return erase_if_impl<K, decltype(always_erase), ReadWriteLock>(key, std::move(always_erase));
    }